

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_inline.cpp
# Opt level: O3

BBLIter __thiscall
mocker::FunctionInline::inlineFunction
          (FunctionInline *this,FunctionModule *caller,BBLIter bbIter,InstListIter callInstIter)

{
  _List_node_base **pp_Var1;
  int iVar2;
  _func_int *p_Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  _List_node_base *p_Var5;
  __buckets_ptr pp_Var6;
  long lVar7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  undefined8 uVar9;
  undefined8 uVar10;
  pointer psVar11;
  element_type *this_00;
  bool bVar12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_1;
  iterator iVar13;
  BBLIter BVar14;
  _List_node_base *p_Var15;
  mapped_type *pmVar16;
  _func_int **pp_Var17;
  mapped_type *pmVar18;
  int *piVar19;
  iterator iVar20;
  _List_node_base *p_Var21;
  _List_node_base *p_Var22;
  ulong uVar23;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_6;
  iterator __position;
  FunctionInline *this_01;
  size_t in_R9;
  _List_node_base **__args;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var24;
  shared_ptr<mocker::ir::Reg> newDest;
  vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
  operands;
  unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  newLabelID;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  newIdent;
  mapped_type callee;
  uint in_stack_fffffffffffffd88;
  _Alloc_hider _Var25;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_270;
  undefined1 local_268 [23];
  undefined1 local_251;
  pointer local_250;
  FunctionModule *local_248;
  _List_node_base *local_240;
  vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
  local_238;
  _List_node_base *local_220;
  undefined1 local_218 [24];
  __node_base _Stack_200;
  float local_1f8;
  size_t local_1f0;
  undefined1 auStack_1e8 [24];
  element_type *peStack_1d0;
  __node_base local_1c8;
  _List_node_base *local_1c0;
  shared_ptr<mocker::ir::Label> local_1b8;
  shared_ptr<mocker::ir::IRInst> local_1a8;
  shared_ptr<mocker::ir::IRInst> local_198;
  _List_node_base *local_180;
  _List_node_base *local_178;
  _List_node_base *local_170;
  undefined1 local_168 [32];
  float local_148;
  pointer local_140;
  _List_node_base _Stack_138;
  shared_ptr<mocker::ir::IRInst> local_128;
  shared_ptr<mocker::ir::IRInst> local_118;
  FunctionModule local_108;
  
  p_Var15 = callInstIter._M_node[1]._M_next;
  if (*(int *)&p_Var15->_M_prev == 0xe) {
    local_250 = (pointer)callInstIter._M_node[1]._M_prev;
    if (local_250 == (pointer)0x0) {
      local_250 = (pointer)0x0;
    }
    else if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&local_250->_M_string_length = *(int *)&local_250->_M_string_length + 1;
      UNLOCK();
    }
    else {
      *(int *)&local_250->_M_string_length = *(int *)&local_250->_M_string_length + 1;
    }
  }
  else {
    local_250 = (pointer)0x0;
    p_Var15 = (_List_node_base *)0x0;
  }
  local_248 = caller;
  iVar13 = std::
           _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::FunctionModule>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::FunctionModule>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::find(&(((this->super_ModulePass).module)->funcs)._M_h,(key_type *)&p_Var15[2]._M_prev);
  if (iVar13.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::FunctionModule>,_true>
      ._M_cur == (__node_type *)0x0) {
    std::__throw_out_of_range("_Map_base::at");
  }
  ir::FunctionModule::FunctionModule
            (&local_108,
             (FunctionModule *)
             ((long)iVar13.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::FunctionModule>,_true>
                    ._M_cur + 0x28));
  if (local_108.isExternal == true) {
    local_220 = (bbIter._M_node)->_M_next;
LAB_0015f600:
    std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_108.predecessors._M_h);
    std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::reference_wrapper<mocker::ir::BasicBlock>_>,_std::allocator<std::pair<const_unsigned_long,_std::reference_wrapper<mocker::ir::BasicBlock>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_108.bbMap._M_h);
    std::__cxx11::_List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::
    _M_clear(&local_108.bbs.
              super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_108.args);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108.identifier._M_dataplus._M_p != &local_108.identifier.field_2) {
      operator_delete(local_108.identifier._M_dataplus._M_p,
                      local_108.identifier.field_2._M_allocated_capacity + 1);
    }
    p_Var15 = local_220;
    if (local_250 != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_250);
    }
    return (BBLIter)p_Var15;
  }
  auStack_1e8._16_8_ = (_List_node_base *)0x0;
  peStack_1d0 = (element_type *)0x0;
  if (p_Var15[1]._M_prev != (_List_node_base *)0x0) {
    local_218._0_8_ = (Load *)(local_218 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"retVal","");
    ir::FunctionModule::makeTempLocalReg((FunctionModule *)local_168,&local_248->identifier);
    uVar9 = local_168._8_8_;
    auStack_1e8._16_8_ = local_168._0_8_;
    this_00 = peStack_1d0;
    local_168._0_8_ = (_List_node_base *)0x0;
    local_168._8_8_ = (element_type *)0x0;
    peStack_1d0 = (element_type *)uVar9;
    if ((this_00 != (element_type *)0x0) &&
       (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00),
       (element_type *)local_168._8_8_ != (element_type *)0x0)) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168._8_8_);
    }
    if ((Load *)local_218._0_8_ != (Load *)(local_218 + 0x10)) {
      operator_delete((void *)local_218._0_8_,
                      (ulong)((long)(_Hash_node_base **)local_218._16_8_ + 1));
    }
    p_Var22 = (local_248->bbs).
              super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>.
              _M_impl._M_node.super__List_node_base._M_next;
    local_218._0_8_ = (Load *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<mocker::ir::Alloca,std::allocator<mocker::ir::Alloca>,std::shared_ptr<mocker::ir::Reg>&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_218 + 8),(Alloca **)local_218,
               (allocator<mocker::ir::Alloca> *)local_168,
               (shared_ptr<mocker::ir::Reg> *)(auStack_1e8 + 0x10));
    local_128.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_218._0_8_;
    local_128.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_;
    local_218._0_8_ = (Load *)0x0;
    local_218._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    ir::BasicBlock::appendInstFront((BasicBlock *)(p_Var22 + 1),&local_128);
    if (local_128.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_128.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_);
    }
  }
  BVar14 = ir::FunctionModule::insertBBAfter(local_248,bbIter);
  __args = &p_Var15[1]._M_prev;
  pp_Var1 = &BVar14._M_node[1]._M_prev;
  local_1c0 = p_Var15;
  std::__cxx11::
  list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>::
  splice((list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
          *)pp_Var1,(int)pp_Var1,(__off64_t *)&bbIter._M_node[1]._M_prev,(int)callInstIter._M_node,
         (__off64_t *)&bbIter._M_node[1]._M_prev,in_R9,in_stack_fffffffffffffd88);
  std::__cxx11::
  list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>::
  _M_erase((list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
            *)pp_Var1,BVar14._M_node[1]._M_prev);
  local_1c8._M_nxt = (_Hash_node_base *)__args;
  if (*__args != (_List_node_base *)0x0) {
    local_218._0_8_ = (Load *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<mocker::ir::Load,std::allocator<mocker::ir::Load>,std::shared_ptr<mocker::ir::Reg>const&,std::shared_ptr<mocker::ir::Reg>&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_218 + 8),(Load **)local_218,
               (allocator<mocker::ir::Load> *)local_168,(shared_ptr<mocker::ir::Reg> *)__args,
               (shared_ptr<mocker::ir::Reg> *)(auStack_1e8 + 0x10));
    p_Var15 = (_List_node_base *)operator_new(0x20);
    uVar9 = local_218._8_8_;
    local_218._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var15[1]._M_next = (_List_node_base *)local_218._0_8_;
    p_Var15[1]._M_prev = (_List_node_base *)uVar9;
    local_218._0_8_ = (Load *)0x0;
    std::__detail::_List_node_base::_M_hook(p_Var15);
    BVar14._M_node[2]._M_prev = (_List_node_base *)((long)&(BVar14._M_node[2]._M_prev)->_M_next + 1)
    ;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_);
    }
  }
  local_218._0_8_ = auStack_1e8;
  local_218._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
  local_218._16_8_ = (_Hash_node_base *)0x0;
  _Stack_200._M_nxt = (_Hash_node_base *)0x0;
  local_1f8 = 1.0;
  local_1f0 = 0;
  auStack_1e8._0_8_ = (__node_base_ptr)0x0;
  p_Var15 = (_List_node_base *)&local_108.bbs;
  local_220 = BVar14._M_node;
  if (p_Var15 !=
      local_108.bbs.
      super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>._M_impl.
      _M_node.super__List_node_base._M_next) {
    do {
      p_Var22 = p_Var15->_M_prev;
      BVar14 = ir::FunctionModule::insertBBAfter(local_248,bbIter);
      if (BVar14._M_node != p_Var22) {
        std::__cxx11::
        list<std::shared_ptr<mocker::ir::IRInst>,std::allocator<std::shared_ptr<mocker::ir::IRInst>>>
        ::_M_assign_dispatch<std::_List_const_iterator<std::shared_ptr<mocker::ir::IRInst>>>
                  ((list<std::shared_ptr<mocker::ir::IRInst>,std::allocator<std::shared_ptr<mocker::ir::IRInst>>>
                    *)&BVar14._M_node[1]._M_prev,p_Var22[1]._M_prev,&p_Var22[1]._M_prev);
      }
      p_Var21 = BVar14._M_node[1]._M_next;
      local_168._0_8_ = p_Var22[1]._M_next;
      pmVar16 = std::__detail::
                _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)local_218,(key_type *)local_168);
      *pmVar16 = (mapped_type)p_Var21;
      p_Var15 = p_Var15->_M_prev;
    } while (p_Var15 !=
             local_108.bbs.
             super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>.
             _M_impl._M_node.super__List_node_base._M_next);
  }
  uVar23 = (ulong)local_108.bbs.
                  super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>.
                  _M_impl._M_node.super__List_node_base._M_next[1]._M_next % (ulong)local_218._8_8_;
  pp_Var17 = (&((IRInst *)local_218._0_8_)->_vptr_IRInst)[uVar23];
  if (pp_Var17 != (_func_int **)0x0) {
    p_Var3 = *pp_Var17;
    p_Var15 = *(_List_node_base **)(p_Var3 + 8);
    do {
      if (local_108.bbs.
          super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>._M_impl.
          _M_node.super__List_node_base._M_next[1]._M_next == p_Var15) {
        pp_Var17 = (_func_int **)operator_new(0x20);
        pp_Var17[1] = (_func_int *)0x100000001;
        *pp_Var17 = (_func_int *)&PTR___Sp_counted_ptr_inplace_001e8af0;
        p_Var3 = *(_func_int **)(p_Var3 + 0x10);
        pp_Var17[2] = (_func_int *)&PTR__Addr_001e8b68;
        pp_Var17[3] = p_Var3;
        local_118.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
        (local_118.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count = 1;
        (local_118.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_weak_count = 1;
        (local_118.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001e8cb8;
        local_118.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)
             (local_118.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi + 1);
        local_118.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi[1]._M_use_count = 0xc;
        local_118.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi[1]._vptr__Sp_counted_base = (_func_int **)&PTR__Jump_001e8d08;
        local_118.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi[2]._vptr__Sp_counted_base = (_func_int **)&PTR__Jump_001e8d28;
        *(_func_int ***)
         &local_118.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi[2]._M_use_count = pp_Var17 + 2;
        local_118.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi[3]._vptr__Sp_counted_base = pp_Var17;
        ir::BasicBlock::appendInst((BasicBlock *)(bbIter._M_node + 1),&local_118);
        p_Var15 = local_220;
        if (local_118.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_118.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        local_168._0_8_ = &_Stack_138;
        local_168._8_8_ = (element_type *)0x1;
        local_168._16_8_ = 0;
        local_168._24_8_ = 0;
        local_148 = 1.0;
        local_140 = (pointer)0x0;
        _Stack_138._M_next = (_List_node_base *)0x0;
        p_Var22 = (bbIter._M_node)->_M_next;
        p_Var21 = p_Var22;
        if (p_Var22 != p_Var15) {
          do {
            local_180 = p_Var21;
            local_170 = (_List_node_base *)&p_Var22[1]._M_prev;
            p_Var15 = p_Var22[1]._M_prev;
            local_178 = p_Var22;
            if (p_Var15 != local_170) {
              do {
                if (*(int *)&(p_Var15[1]._M_next)->_M_prev == 0xf) {
                  p_Var15 = p_Var15[1]._M_prev;
                  if (p_Var15 != (_List_node_base *)0x0) {
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      *(int *)&p_Var15->_M_prev = *(int *)&p_Var15->_M_prev + 1;
                      UNLOCK();
                    }
                    else {
                      *(int *)&p_Var15->_M_prev = *(int *)&p_Var15->_M_prev + 1;
                    }
                  }
                  __assert_fail("!ir::dyc<ir::Phi>(inst)",
                                "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/function_inline.cpp"
                                ,0xa0,
                                "ir::BBLIter mocker::FunctionInline::inlineFunction(ir::FunctionModule &, ir::BBLIter, ir::InstListIter)"
                               );
                }
                local_240 = p_Var15 + 1;
                ir::getDest((ir *)local_268,(shared_ptr<mocker::ir::IRInst> *)local_240);
                _Var25._M_p = (pointer)local_268._0_8_;
                _Stack_270._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_268._8_8_;
                local_268._0_8_ = (_List_node_base *)0x0;
                local_268._8_8_ = (Module *)0x0;
                ir::dycLocalReg((ir *)&local_238,
                                (shared_ptr<mocker::ir::Addr> *)&stack0xfffffffffffffd88);
                if ((Module *)_Stack_270._M_pi != (Module *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_270._M_pi);
                }
                if ((Module *)local_268._8_8_ != (Module *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_268._8_8_);
                }
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    local_238.
                    super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                    ._M_impl.super__Vector_impl_data._M_start !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ir::FunctionModule::makeTempLocalReg
                            ((FunctionModule *)&stack0xfffffffffffffd88,&local_248->identifier);
                  ir::copyWithReplacedDest
                            ((ir *)local_268,(shared_ptr<mocker::ir::IRInst> *)local_240,
                             (shared_ptr<mocker::ir::Reg> *)&stack0xfffffffffffffd88);
                  uVar10 = local_268._8_8_;
                  uVar9 = local_268._0_8_;
                  local_268._0_8_ = (_List_node_base *)0x0;
                  local_268._8_8_ = (Module *)0x0;
                  p_Var24 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var15[1]._M_prev;
                  p_Var15[1]._M_next = (_List_node_base *)uVar9;
                  p_Var15[1]._M_prev = (_List_node_base *)uVar10;
                  if ((p_Var24 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                     (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var24),
                     (Module *)local_268._8_8_ != (Module *)0x0)) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_268._8_8_);
                  }
                  pmVar18 = std::__detail::
                            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                          *)local_168,
                                         (key_type *)
                                         ((long)local_238.
                                                super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start + 8));
                  std::__cxx11::string::_M_assign((string *)pmVar18);
                  if ((Module *)_Stack_270._M_pi != (Module *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_270._M_pi);
                  }
                }
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    local_238.
                    super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             local_238.
                             super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
                }
                ir::getOperandsUsed(&local_238,(shared_ptr<mocker::ir::IRInst> *)local_240);
                psVar11 = local_238.
                          super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                for (p_Var24 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               local_238.
                               super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                    p_Var24 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)psVar11;
                    p_Var24 = p_Var24 + 1) {
                  this_01 = (FunctionInline *)&stack0xfffffffffffffd88;
                  ir::dycLocalReg((ir *)&stack0xfffffffffffffd88,
                                  (shared_ptr<mocker::ir::Addr> *)p_Var24);
                  if ((_List_node_base *)_Var25._M_p != (_List_node_base *)0x0) {
                    bVar12 = isParameter(this_01,&local_108,(string *)(_Var25._M_p + 8));
                    if (bVar12) {
                      p_Var22 = *(_List_node_base **)(_Var25._M_p + 8);
                      piVar19 = __errno_location();
                      iVar2 = *piVar19;
                      *piVar19 = 0;
                      uVar23 = strtol((char *)p_Var22,(char **)local_268,10);
                      if ((_List_node_base *)local_268._0_8_ != p_Var22) {
                        if (*piVar19 == 0) {
                          *piVar19 = iVar2;
                        }
                        else if (*piVar19 == 0x22) goto LAB_0015f6ce;
                        if (uVar23 < (ulong)((long)local_1c0[5]._M_next - (long)local_1c0[4]._M_prev
                                            >> 4)) {
                          p_Var22 = local_1c0[4]._M_prev + uVar23;
                          ((__shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2> *)
                          &p_Var24->_vptr__Sp_counted_base)->_M_ptr =
                               (element_type *)p_Var22->_M_next;
                          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                                     &p_Var24->_M_use_count,
                                     (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p_Var22->_M_prev
                                    );
                          goto LAB_0015ef3b;
                        }
                        std::__throw_out_of_range_fmt
                                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                   ,uVar23);
                      }
                      std::__throw_invalid_argument("stol");
LAB_0015f6ce:
                      std::__throw_out_of_range("stol");
                    }
                    iVar20 = std::
                             _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                             ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                     *)local_168,(key_type *)(_Var25._M_p + 8));
                    if (iVar20.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                        ._M_cur == (__node_type *)0x0) {
                      std::__throw_out_of_range("_Map_base::at");
                    }
                    local_268._0_8_ = (element_type *)0x0;
                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                    __shared_count<mocker::ir::Reg,std::allocator<mocker::ir::Reg>,std::__cxx11::string&>
                              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_268 + 8),
                               (Reg **)local_268,(allocator<mocker::ir::Reg> *)&local_1b8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)iVar20.
                                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                      ._M_cur + 0x28));
                    uVar10 = local_268._8_8_;
                    uVar9 = local_268._0_8_;
                    local_268._0_8_ = (_List_node_base *)0x0;
                    local_268._8_8_ = (Module *)0x0;
                    p_Var4 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p_Var24->_M_use_count)
                             ->_M_pi;
                    ((__shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2> *)
                    &p_Var24->_vptr__Sp_counted_base)->_M_ptr = (element_type *)uVar9;
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p_Var24->_M_use_count)->_M_pi =
                         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar10;
                    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
                    }
                    if ((Module *)local_268._8_8_ != (Module *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_268._8_8_);
                    }
                  }
LAB_0015ef3b:
                  if ((Module *)_Stack_270._M_pi != (Module *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_270._M_pi);
                  }
                }
                ir::copyWithReplacedOperands
                          ((ir *)&stack0xfffffffffffffd88,
                           (shared_ptr<mocker::ir::IRInst> *)local_240,&local_238);
                _Var8._M_pi = _Stack_270._M_pi;
                _Stack_270._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                p_Var24 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var15[1]._M_prev;
                p_Var15[1]._M_next = (_List_node_base *)_Var25._M_p;
                p_Var15[1]._M_prev = (_List_node_base *)_Var8._M_pi;
                if ((p_Var24 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                   (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var24),
                   (Module *)_Stack_270._M_pi != (Module *)0x0)) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_270._M_pi);
                }
                p_Var22 = local_240->_M_next;
                if (*(int *)&p_Var22->_M_prev == 0xc) {
                  p_Var24 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var15[1]._M_prev;
                  if (p_Var24 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      p_Var24->_M_use_count = p_Var24->_M_use_count + 1;
                      UNLOCK();
                    }
                    else {
                      p_Var24->_M_use_count = p_Var24->_M_use_count + 1;
                    }
                  }
                  p_Var22 = (p_Var22[1]._M_prev)->_M_prev;
                  uVar23 = (ulong)p_Var22 % (ulong)local_218._8_8_;
                  pp_Var17 = (&((IRInst *)local_218._0_8_)->_vptr_IRInst)[uVar23];
                  if (pp_Var17 == (_func_int **)0x0) {
LAB_0015f681:
                    std::__throw_out_of_range("_Map_base::at");
                  }
                  p_Var3 = *pp_Var17;
                  p_Var21 = *(_List_node_base **)(p_Var3 + 8);
                  while (p_Var22 != p_Var21) {
                    p_Var3 = *(_func_int **)p_Var3;
                    if ((p_Var3 == (_func_int *)0x0) ||
                       (p_Var21 = *(_List_node_base **)(p_Var3 + 8),
                       (ulong)p_Var21 % (ulong)local_218._8_8_ != uVar23)) goto LAB_0015f681;
                  }
                  p_Var21 = (_List_node_base *)operator_new(0x20);
                  p_Var21->_M_prev = (_List_node_base *)0x100000001;
                  p_Var21->_M_next = (_List_node_base *)&PTR___Sp_counted_ptr_inplace_001e8af0;
                  p_Var22 = *(_List_node_base **)(p_Var3 + 0x10);
                  p_Var21[1]._M_next = (_List_node_base *)&PTR__Addr_001e8b68;
                  p_Var21[1]._M_prev = p_Var22;
                  p_Var22 = (_List_node_base *)operator_new(0x38);
                  p_Var22->_M_prev = (_List_node_base *)0x100000001;
                  p_Var22->_M_next = (_List_node_base *)&PTR___Sp_counted_ptr_inplace_001e8cb8;
                  *(undefined4 *)&p_Var22[1]._M_prev = 0xc;
                  p_Var22[1]._M_next = (_List_node_base *)&PTR__Jump_001e8d08;
                  p_Var22[2]._M_next = (_List_node_base *)&PTR__Jump_001e8d28;
                  p_Var22[2]._M_prev = p_Var21 + 1;
                  p_Var22[3]._M_next = p_Var21;
                  p_Var15[1]._M_next = p_Var22 + 1;
                  p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var15[1]._M_prev;
                  p_Var15[1]._M_prev = p_Var22;
                  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
                  }
joined_r0x0015f2b7:
                  if (p_Var24 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var24);
                  }
                }
                else if (*(int *)&p_Var22->_M_prev == 0xb) {
                  p_Var24 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var15[1]._M_prev;
                  if (p_Var24 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      p_Var24->_M_use_count = p_Var24->_M_use_count + 1;
                      UNLOCK();
                    }
                    else {
                      p_Var24->_M_use_count = p_Var24->_M_use_count + 1;
                    }
                  }
                  p_Var21 = (p_Var22[2]._M_prev)->_M_prev;
                  uVar23 = (ulong)p_Var21 % (ulong)local_218._8_8_;
                  pp_Var17 = (&((IRInst *)local_218._0_8_)->_vptr_IRInst)[uVar23];
                  if (pp_Var17 == (_func_int **)0x0) {
LAB_0015f68d:
                    std::__throw_out_of_range("_Map_base::at");
                  }
                  p_Var3 = *pp_Var17;
                  p_Var5 = *(_List_node_base **)(p_Var3 + 8);
                  while (p_Var21 != p_Var5) {
                    p_Var3 = *(_func_int **)p_Var3;
                    if ((p_Var3 == (_func_int *)0x0) ||
                       (p_Var5 = *(_List_node_base **)(p_Var3 + 8),
                       (ulong)p_Var5 % (ulong)local_218._8_8_ != uVar23)) goto LAB_0015f68d;
                  }
                  local_268._8_8_ = operator_new(0x20);
                  (((Module *)local_268._8_8_)->globalVars).
                  super__List_base<mocker::ir::GlobalVar,_std::allocator<mocker::ir::GlobalVar>_>.
                  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x100000001;
                  (((Module *)local_268._8_8_)->globalVars).
                  super__List_base<mocker::ir::GlobalVar,_std::allocator<mocker::ir::GlobalVar>_>.
                  _M_impl._M_node.super__List_node_base._M_next =
                       (_List_node_base *)&PTR___Sp_counted_ptr_inplace_001e8af0;
                  local_268._0_8_ =
                       &(((Module *)local_268._8_8_)->globalVars).
                        super__List_base<mocker::ir::GlobalVar,_std::allocator<mocker::ir::GlobalVar>_>
                        ._M_impl._M_node._M_size;
                  pp_Var6 = *(__buckets_ptr *)(p_Var3 + 0x10);
                  (((Module *)local_268._8_8_)->globalVars).
                  super__List_base<mocker::ir::GlobalVar,_std::allocator<mocker::ir::GlobalVar>_>.
                  _M_impl._M_node._M_size = (size_t)&PTR__Addr_001e8b68;
                  (((Module *)local_268._8_8_)->funcs)._M_h._M_buckets = pp_Var6;
                  p_Var21 = (p_Var22[3]._M_prev)->_M_prev;
                  uVar23 = (ulong)p_Var21 % (ulong)local_218._8_8_;
                  pp_Var17 = (&((IRInst *)local_218._0_8_)->_vptr_IRInst)[uVar23];
                  if (pp_Var17 == (_func_int **)0x0) {
LAB_0015f699:
                    std::__throw_out_of_range("_Map_base::at");
                  }
                  p_Var3 = *pp_Var17;
                  p_Var5 = *(_List_node_base **)(p_Var3 + 8);
                  while (p_Var21 != p_Var5) {
                    p_Var3 = *(_func_int **)p_Var3;
                    if ((p_Var3 == (_func_int *)0x0) ||
                       (p_Var5 = *(_List_node_base **)(p_Var3 + 8),
                       (ulong)p_Var5 % (ulong)local_218._8_8_ != uVar23)) goto LAB_0015f699;
                  }
                  local_1b8.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi =
                       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
                  (local_1b8.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count = 1;
                  (local_1b8.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_weak_count = 1;
                  (local_1b8.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_vptr__Sp_counted_base =
                       (_func_int **)&PTR___Sp_counted_ptr_inplace_001e8af0;
                  local_1b8.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                       = (element_type *)
                         (local_1b8.
                          super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi + 1);
                  lVar7 = *(long *)(p_Var3 + 0x10);
                  local_1b8.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi[1]._vptr__Sp_counted_base = (_func_int **)&PTR__Addr_001e8b68;
                  local_1b8.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi[1]._M_use_count = (int)lVar7;
                  local_1b8.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi[1]._M_weak_count = (int)((ulong)lVar7 >> 0x20);
                  _Var25._M_p = (pointer)0x0;
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                  __shared_count<mocker::ir::Branch,std::allocator<mocker::ir::Branch>,std::shared_ptr<mocker::ir::Addr>const&,std::shared_ptr<mocker::ir::Label>,std::shared_ptr<mocker::ir::Label>>
                            (&_Stack_270,(Branch **)&stack0xfffffffffffffd88,
                             (allocator<mocker::ir::Branch> *)&local_251,
                             (shared_ptr<mocker::ir::Addr> *)&p_Var22[1]._M_prev,
                             (shared_ptr<mocker::ir::Label> *)local_268,&local_1b8);
                  _Var8._M_pi = _Stack_270._M_pi;
                  _Stack_270._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var15[1]._M_prev;
                  p_Var15[1]._M_next = (_List_node_base *)_Var25._M_p;
                  p_Var15[1]._M_prev = (_List_node_base *)_Var8._M_pi;
                  if ((p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                     (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4),
                     (Module *)_Stack_270._M_pi != (Module *)0x0)) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_270._M_pi);
                  }
                  if (local_1b8.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              (local_1b8.
                               super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi);
                  }
                  if ((Module *)local_268._8_8_ != (Module *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_268._8_8_);
                  }
                  goto joined_r0x0015f2b7;
                }
                if (*(int *)&local_240->_M_next->_M_prev == 9) {
                  p_Var24 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var15[1]._M_prev;
                  if (p_Var24 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      p_Var24->_M_use_count = p_Var24->_M_use_count + 1;
                      UNLOCK();
                    }
                    else {
                      p_Var24->_M_use_count = p_Var24->_M_use_count + 1;
                    }
                  }
                  p_Var22 = (local_248->bbs).
                            super__List_base<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>
                            ._M_impl._M_node.super__List_node_base._M_next;
                  std::__cxx11::
                  list<std::shared_ptr<mocker::ir::IRInst>,std::allocator<std::shared_ptr<mocker::ir::IRInst>>>
                  ::_M_insert<std::shared_ptr<mocker::ir::IRInst>>
                            ((list<std::shared_ptr<mocker::ir::IRInst>,std::allocator<std::shared_ptr<mocker::ir::IRInst>>>
                              *)&p_Var22[1]._M_prev,p_Var22[1]._M_prev,
                             (shared_ptr<mocker::ir::IRInst> *)local_240);
                  p_Var22 = (_List_node_base *)operator_new(0x20);
                  p_Var22->_M_prev = (_List_node_base *)0x100000001;
                  p_Var22->_M_next = (_List_node_base *)&PTR___Sp_counted_ptr_inplace_001e8d90;
                  *(undefined4 *)&p_Var22[1]._M_prev = 0;
                  p_Var22[1]._M_next = (_List_node_base *)&PTR__IRInst_001e8de0;
                  p_Var15[1]._M_next = p_Var22 + 1;
                  p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var15[1]._M_prev;
                  p_Var15[1]._M_prev = p_Var22;
                  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
                  }
                  if (p_Var24 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var24);
                  }
                }
                std::
                vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                ::~vector(&local_238);
                p_Var15 = p_Var15->_M_next;
              } while (p_Var15 != local_170);
            }
            p_Var22 = local_178->_M_next;
            p_Var21 = local_180;
          } while (p_Var22 != local_220);
          p_Var22 = local_180;
          p_Var15 = local_220;
          if (local_180 != local_220) {
            do {
              __position._M_node = p_Var22[2]._M_next;
              p_Var21 = __position._M_node[1]._M_next;
              if (*(int *)&p_Var21->_M_prev == 0xd) {
                p_Var24 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                          __position._M_node[1]._M_prev;
                if (p_Var24 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    p_Var24->_M_use_count = p_Var24->_M_use_count + 1;
                    UNLOCK();
                    __position._M_node = p_Var22[2]._M_next;
                  }
                  else {
                    p_Var24->_M_use_count = p_Var24->_M_use_count + 1;
                  }
                }
                std::__cxx11::
                list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
                ::_M_erase((list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
                            *)&p_Var22[1]._M_prev,__position);
                if ((_List_node_base *)(local_1c8._M_nxt)->_M_nxt != (_List_node_base *)0x0) {
                  if (p_Var21[1]._M_prev == (_List_node_base *)0x0) {
                    _Stack_270._M_pi =
                         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
                    (((Module *)_Stack_270._M_pi)->globalVars).
                    super__List_base<mocker::ir::GlobalVar,_std::allocator<mocker::ir::GlobalVar>_>.
                    _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x100000001;
                    (((Module *)_Stack_270._M_pi)->globalVars).
                    super__List_base<mocker::ir::GlobalVar,_std::allocator<mocker::ir::GlobalVar>_>.
                    _M_impl._M_node.super__List_node_base._M_next =
                         (_List_node_base *)&PTR___Sp_counted_ptr_inplace_001e9d60;
                    (((Module *)_Stack_270._M_pi)->globalVars).
                    super__List_base<mocker::ir::GlobalVar,_std::allocator<mocker::ir::GlobalVar>_>.
                    _M_impl._M_node._M_size = (size_t)&PTR__Addr_001e9db0;
                    (((Module *)_Stack_270._M_pi)->funcs)._M_h._M_buckets = (__buckets_ptr)0x0;
                  }
                  else {
                    _Stack_270._M_pi =
                         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var21[2]._M_next;
                    if ((Module *)_Stack_270._M_pi != (Module *)0x0) {
                      if (__libc_single_threaded == '\0') {
                        LOCK();
                        pp_Var1 = &(((Module *)_Stack_270._M_pi)->globalVars).
                                   super__List_base<mocker::ir::GlobalVar,_std::allocator<mocker::ir::GlobalVar>_>
                                   ._M_impl._M_node.super__List_node_base._M_prev;
                        *(int *)pp_Var1 = *(int *)pp_Var1 + 1;
                        UNLOCK();
                      }
                      else {
                        pp_Var1 = &(((Module *)_Stack_270._M_pi)->globalVars).
                                   super__List_base<mocker::ir::GlobalVar,_std::allocator<mocker::ir::GlobalVar>_>
                                   ._M_impl._M_node.super__List_node_base._M_prev;
                        *(int *)pp_Var1 = *(int *)pp_Var1 + 1;
                      }
                    }
                  }
                  local_238.
                  super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                  __shared_count<mocker::ir::Store,std::allocator<mocker::ir::Store>,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Addr>const>
                            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                             &local_238.
                              super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish,(Store **)&local_238,
                             (allocator<mocker::ir::Store> *)local_268,
                             (shared_ptr<mocker::ir::Reg> *)(auStack_1e8 + 0x10),
                             (shared_ptr<mocker::ir::Addr> *)&stack0xfffffffffffffd88);
                  local_198.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr = (element_type *)
                           local_238.
                           super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  local_198.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi =
                       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_238.
                       super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  local_238.
                  super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  local_238.
                  super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  ir::BasicBlock::appendInst((BasicBlock *)(p_Var22 + 1),&local_198);
                  if (local_198.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              (local_198.
                               super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi);
                  }
                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      local_238.
                      super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish !=
                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               local_238.
                               super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish);
                  }
                  if ((Module *)_Stack_270._M_pi != (Module *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_270._M_pi);
                  }
                }
                p_Var15 = p_Var15[1]._M_next;
                pp_Var17 = (_func_int **)operator_new(0x20);
                pp_Var17[1] = (_func_int *)0x100000001;
                *pp_Var17 = (_func_int *)&PTR___Sp_counted_ptr_inplace_001e8af0;
                pp_Var17[2] = (_func_int *)&PTR__Addr_001e8b68;
                pp_Var17[3] = (_func_int *)p_Var15;
                local_1a8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi =
                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
                (local_1a8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count = 1;
                (local_1a8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_weak_count = 1;
                (local_1a8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_vptr__Sp_counted_base =
                     (_func_int **)&PTR___Sp_counted_ptr_inplace_001e8cb8;
                local_1a8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     = (element_type *)
                       (local_1a8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi + 1);
                local_1a8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi[1]._M_use_count = 0xc;
                local_1a8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi[1]._vptr__Sp_counted_base = (_func_int **)&PTR__Jump_001e8d08;
                local_1a8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi[2]._vptr__Sp_counted_base = (_func_int **)&PTR__Jump_001e8d28;
                *(_func_int ***)
                 &local_1a8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi[2]._M_use_count = pp_Var17 + 2;
                local_1a8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi[3]._vptr__Sp_counted_base = pp_Var17;
                ir::BasicBlock::appendInst((BasicBlock *)(p_Var22 + 1),&local_1a8);
                p_Var15 = local_220;
                if (local_1a8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_1a8.
                             super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
                }
                if (p_Var24 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var24);
                }
              }
              pp_Var1 = &p_Var22->_M_next;
              p_Var22 = *pp_Var1;
            } while (*pp_Var1 != p_Var15);
          }
        }
        std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)local_168);
        std::
        _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)local_218);
        if (peStack_1d0 != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_1d0);
        }
        goto LAB_0015f600;
      }
      p_Var3 = *(_func_int **)p_Var3;
    } while ((p_Var3 != (_func_int *)0x0) &&
            (p_Var15 = *(_List_node_base **)(p_Var3 + 8),
            (ulong)p_Var15 % (ulong)local_218._8_8_ == uVar23));
  }
  std::__throw_out_of_range("_Map_base::at");
}

Assistant:

ir::BBLIter FunctionInline::inlineFunction(ir::FunctionModule &caller,
                                           ir::BBLIter bbIter,
                                           ir::InstListIter callInstIter) {
  auto call = ir::dyc<ir::Call>(*callInstIter);
  // do not use a reference here
  auto callee = module.getFuncs().at(call->getFuncName());
  if (callee.isExternalFunc())
    return ++bbIter;

  // create a temporary variable to hold the return value
  std::shared_ptr<ir::Reg> retVal = nullptr;
  if (call->getDest()) {
    retVal = caller.makeTempLocalReg("retVal");
    caller.getFirstBB()->appendInstFront(std::make_shared<ir::Alloca>(retVal));
  }

  // move the subsequent instructions to a new BB
  auto succBBIter = caller.insertBBAfter(bbIter);
  succBBIter->getMutableInsts().splice(succBBIter->getMutableInsts().end(),
                                       bbIter->getMutableInsts(), callInstIter,
                                       bbIter->getMutableInsts().end());
  succBBIter->getMutableInsts().pop_front();
  if (call->getDest())
    succBBIter->getMutableInsts().emplace_front(
        std::make_shared<ir::Load>(call->getDest(), retVal));

  // insert new BBs
  std::unordered_map<std::size_t, std::size_t> newLabelID;
  for (auto riter = callee.getBBs().rbegin(); riter != callee.getBBs().rend();
       ++riter) {
    const auto &bb = *riter;
    auto &curBB = *caller.insertBBAfter(bbIter);
    curBB.getMutableInsts() = bb.getInsts();
    newLabelID[bb.getLabelID()] = curBB.getLabelID();
  }
  bbIter->appendInst(std::make_shared<ir::Jump>(std::make_shared<ir::Label>(
      newLabelID.at(callee.getFirstBB()->getLabelID()))));

  // rename identifiers & LabelID; move alloca's to the first block
  std::unordered_map<std::string, std::string> newIdent;
  auto insertedBeg = bbIter;
  ++insertedBeg;
  for (auto iter = insertedBeg; iter != succBBIter; ++iter) {
    auto &bb = *iter;
    for (auto &inst : bb.getMutableInsts()) {
      assert(!ir::dyc<ir::Phi>(inst));
      if (auto dest = ir::dycLocalReg(ir::getDest(inst))) {
        auto newDest = caller.makeTempLocalReg(dest->getIdentifier());
        inst = ir::copyWithReplacedDest(inst, newDest);
        newIdent[dest->getIdentifier()] = newDest->getIdentifier();
      }

      auto operands = ir::getOperandsUsed(inst);
      for (auto &operand : operands) {
        auto reg = ir::dycLocalReg(operand);
        if (!reg)
          continue;
        if (isParameter(callee, reg->getIdentifier())) {
          auto n = std::stol(reg->getIdentifier(), nullptr);
          operand = call->getArgs().at((std::size_t)n);
          continue;
        }
        operand = std::make_shared<ir::Reg>(newIdent.at(reg->getIdentifier()));
      }
      inst = ir::copyWithReplacedOperands(inst, operands);

      if (auto br = ir::dyc<ir::Branch>(inst)) {
        inst = std::make_shared<ir::Branch>(
            br->getCondition(),
            std::make_shared<ir::Label>(newLabelID.at(br->getThen()->getID())),
            std::make_shared<ir::Label>(newLabelID.at(br->getElse()->getID())));
      } else if (auto jump = ir::dyc<ir::Jump>(inst)) {
        inst = std::make_shared<ir::Jump>(std::make_shared<ir::Label>(
            newLabelID.at(jump->getLabel()->getID())));
      }

      if (auto alloca = ir::dyc<ir::Alloca>(inst)) {
        caller.getFirstBB()->getMutableInsts().push_front(std::move(inst));
        inst = std::make_shared<ir::Deleted>();
      }
    }
  }

  // rewrite Ret's
  for (auto iter = insertedBeg; iter != succBBIter; ++iter) {
    auto &bb = *iter;
    auto ret = ir::dyc<ir::Ret>(bb.getMutableInsts().back());
    if (!ret)
      continue;
    bb.getMutableInsts().pop_back();
    if (call->getDest()) {
      bb.appendInst(std::make_shared<ir::Store>(
          retVal,
          ret->getVal() ? ret->getVal() : std::make_shared<ir::IntLiteral>(0)));
    }
    bb.appendInst(std::make_shared<ir::Jump>(
        std::make_shared<ir::Label>(succBBIter->getLabelID())));
  }

  return succBBIter;
}